

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O2

QDateTime __thiscall
QLocale::toDateTime(QLocale *this,QString *string,FormatType format,QCalendar cal,int baseYear)

{
  undefined4 in_register_00000014;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  dateTimeFormat((QString *)&local_50,(QLocale *)string,(FormatType)cal.d_ptr);
  toDateTime(this,string,(QString *)CONCAT44(in_register_00000014,format),
             (QCalendarBackend *)&local_50,baseYear);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QDateTime)(Data)this;
  }
  __stack_chk_fail();
}

Assistant:

QDateTime QLocale::toDateTime(const QString &string, FormatType format, QCalendar cal,
                              int baseYear) const
{
    return toDateTime(string, dateTimeFormat(format), cal, baseYear);
}